

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O1

Gia_Man_t * Gia_ManFramesInit(Gia_Man_t *pAig,Gia_ParFra_t *pPars)

{
  char *pcVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  Gia_ManFra_t *p;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  Gia_Man_t *pGVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  Vec_Int_t *pVVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  
  p = (Gia_ManFra_t *)malloc(0x28);
  p->pPars = (Gia_ParFra_t *)0x0;
  p->pAig = (Gia_Man_t *)0x0;
  p->vIns = (Vec_Ptr_t *)0x0;
  p->vAnds = (Vec_Ptr_t *)0x0;
  p->vOuts = (Vec_Ptr_t *)0x0;
  p->pAig = pAig;
  p->pPars = pPars;
  Gia_ManFraSupports(p);
  lVar17 = (long)p->vIns->nSize;
  iVar21 = 0;
  iVar8 = 0;
  if (0 < lVar17) {
    lVar20 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + *(int *)((long)p->vIns->pArray[lVar20] + 4);
      lVar20 = lVar20 + 1;
    } while (lVar17 != lVar20);
  }
  lVar17 = (long)p->vAnds->nSize;
  if (0 < lVar17) {
    lVar20 = 0;
    iVar21 = 0;
    do {
      iVar21 = iVar21 + *(int *)((long)p->vAnds->pArray[lVar20] + 4);
      lVar20 = lVar20 + 1;
    } while (lVar17 != lVar20);
  }
  lVar17 = (long)p->vOuts->nSize;
  if (lVar17 < 1) {
    iVar15 = 0;
  }
  else {
    lVar20 = 0;
    iVar15 = 0;
    do {
      iVar15 = iVar15 + *(int *)((long)p->vOuts->pArray[lVar20] + 4);
      lVar20 = lVar20 + 1;
    } while (lVar17 != lVar20);
  }
  p_00 = Gia_ManStart(iVar21 + iVar8 + iVar15);
  pcVar1 = pAig->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar1);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar1);
  }
  p_00->pName = pcVar11;
  pcVar1 = pAig->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar1);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar1);
  }
  p_00->pSpec = pcVar11;
  Gia_ManHashAlloc(p_00);
  pAig->pObjs->Value = 0;
  if (0 < pPars->nFrames) {
    uVar23 = 0;
    do {
      if ((((long)p->vIns->nSize <= (long)uVar23) || ((long)p->vAnds->nSize <= (long)uVar23)) ||
         ((long)p->vOuts->nSize <= (long)uVar23)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vIns->pArray[uVar23];
      pvVar3 = p->vAnds->pArray[uVar23];
      pvVar4 = p->vOuts->pArray[uVar23];
      if (pPars->fVerbose != 0) {
        printf("Frame %3d : CI = %6d. AND = %6d. CO = %6d.\n",uVar23 & 0xffffffff,
               (ulong)*(uint *)((long)pvVar2 + 4),(ulong)*(uint *)((long)pvVar3 + 4),
               (ulong)*(uint *)((long)pvVar4 + 4));
      }
      pVVar19 = pAig->vCis;
      uVar16 = pVVar19->nSize;
      uVar18 = (ulong)uVar16;
      uVar9 = uVar16 - pAig->nRegs;
      uVar13 = (ulong)uVar9;
      if (uVar9 != 0 && pAig->nRegs <= (int)uVar16) {
        lVar17 = 0;
        do {
          uVar16 = (uint)uVar18;
          if ((int)uVar16 <= lVar17) goto LAB_00740f19;
          iVar8 = pVVar19->pArray[lVar17];
          if (((long)iVar8 < 0) || (pAig->nObjs <= iVar8)) goto LAB_00740ebc;
          pGVar5 = pAig->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          pGVar12 = Gia_ManAppendObj(p_00);
          uVar13 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 = uVar13 | 0x9fffffff;
          *(ulong *)pGVar12 =
               uVar13 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar6 = p_00->pObjs;
          if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) {
LAB_00740edb:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * -0x55555555);
          pGVar6 = p_00->pObjs;
          if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_00740edb;
          pGVar5[iVar8].Value = (int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * 0x55555556;
          lVar17 = lVar17 + 1;
          pVVar19 = pAig->vCis;
          uVar16 = pVVar19->nSize;
          uVar18 = (ulong)(int)uVar16;
          uVar13 = uVar18 - (long)pAig->nRegs;
        } while (lVar17 < (long)uVar13);
      }
      uVar9 = *(uint *)((long)pvVar2 + 4);
      iVar8 = (int)uVar13;
      if (uVar23 == 0) {
        if (0 < (int)uVar9) {
          lVar17 = *(long *)((long)pvVar2 + 8);
          uVar13 = 0;
          do {
            iVar21 = *(int *)(lVar17 + uVar13 * 4);
            if (((long)iVar21 < 0) || (pAig->nObjs <= iVar21)) goto LAB_00740ebc;
            if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar5 = pAig->pObjs + iVar21;
            uVar7 = *(undefined8 *)pGVar5;
            if (((uint)uVar7 & 0x9fffffff) != 0x9fffffff) {
              __assert_fail("Gia_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                            ,0x2f7,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
            }
            if (iVar8 <= (int)((uint)((ulong)uVar7 >> 0x20) & 0x1fffffff)) {
              pGVar5->Value = 0;
            }
            uVar13 = uVar13 + 1;
          } while (uVar9 != uVar13);
        }
      }
      else if (0 < (int)uVar9) {
        lVar17 = *(long *)((long)pvVar2 + 8);
        uVar13 = 0;
        do {
          iVar21 = *(int *)(lVar17 + uVar13 * 4);
          if (((long)iVar21 < 0) || (pAig->nObjs <= iVar21)) goto LAB_00740ebc;
          pGVar5 = pAig->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          uVar7 = *(undefined8 *)(pGVar5 + iVar21);
          if (((uint)uVar7 & 0x9fffffff) != 0x9fffffff) {
            __assert_fail("Gia_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                          ,0x300,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
          }
          uVar22 = (uint)((ulong)uVar7 >> 0x20);
          if (iVar8 <= (int)(uVar22 & 0x1fffffff)) {
            uVar22 = uVar22 & 0x1fffffff;
            if ((int)uVar22 < iVar8) {
              __assert_fail("Gia_ObjIsRo(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar15 = pAig->vCos->nSize;
            uVar22 = (iVar15 - uVar16) + uVar22;
            if (((int)uVar22 < 0) || (iVar15 <= (int)uVar22)) {
LAB_00740f19:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar15 = pAig->vCos->pArray[uVar22];
            if (((long)iVar15 < 0) || (pAig->nObjs <= iVar15)) goto LAB_00740ebc;
            pGVar5[iVar21].Value = pGVar5[iVar15].Value;
          }
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
      }
      if (0 < *(int *)((long)pvVar3 + 4)) {
        lVar17 = 0;
        do {
          iVar8 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar17 * 4);
          if (((long)iVar8 < 0) || (pAig->nObjs <= iVar8)) goto LAB_00740ebc;
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar5 = pAig->pObjs + iVar8;
          uVar13 = *(ulong *)pGVar5;
          if (((int)(uint)uVar13 < 0) || (uVar16 = (uint)uVar13 & 0x1fffffff, uVar16 == 0x1fffffff))
          {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                          ,0x321,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
          }
          if ((int)pGVar5[-(ulong)uVar16].Value < 0) goto LAB_00740efa;
          uVar9 = (uint)(uVar13 >> 0x20);
          if ((int)pGVar5[-(ulong)(uVar9 & 0x1fffffff)].Value < 0) goto LAB_00740efa;
          uVar16 = Gia_ManHashAnd(p_00,pGVar5[-(ulong)uVar16].Value ^ (uint)(uVar13 >> 0x1d) & 1,
                                  pGVar5[-(ulong)(uVar9 & 0x1fffffff)].Value ^ uVar9 >> 0x1d & 1);
          pGVar5->Value = uVar16;
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)((long)pvVar3 + 4));
      }
      if (0 < *(int *)((long)pvVar4 + 4)) {
        lVar17 = 0;
        do {
          iVar8 = *(int *)(*(long *)((long)pvVar4 + 8) + lVar17 * 4);
          if (((long)iVar8 < 0) || (pAig->nObjs <= iVar8)) {
LAB_00740ebc:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar5 = pAig->pObjs + iVar8;
          uVar16 = (uint)*(undefined8 *)pGVar5;
          if ((-1 < (int)uVar16) || ((uVar16 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                          ,0x326,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
          }
          uVar9 = pGVar5[-(ulong)(uVar16 & 0x1fffffff)].Value;
          if ((int)((uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) & 0x1fffffff) <
              pAig->vCos->nSize - pAig->nRegs) {
            if ((int)uVar9 < 0) goto LAB_00740efa;
            uVar9 = Gia_ManAppendCo(p_00,uVar9 ^ uVar16 >> 0x1d & 1);
          }
          else {
            if ((int)uVar9 < 0) {
LAB_00740efa:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            uVar9 = uVar9 ^ uVar16 >> 0x1d & 1;
          }
          pGVar5->Value = uVar9;
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)((long)pvVar4 + 4));
      }
      uVar23 = uVar23 + 1;
    } while ((long)uVar23 < (long)pPars->nFrames);
  }
  Gia_ManFraStop(p);
  Gia_ManHashStop(p_00);
  iVar8 = Gia_ManCombMarkUsed(p_00);
  uVar16 = ~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs;
  if (iVar8 < (int)uVar16) {
    pGVar14 = Gia_ManDupMarked(p_00);
    if (pPars->fVerbose != 0) {
      printf("Before cleanup = %d nodes. After cleanup = %d nodes.\n",
             (ulong)(uint)(~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs),
             (ulong)(uint)(~(pGVar14->vCos->nSize + pGVar14->vCis->nSize) + pGVar14->nObjs));
    }
    Gia_ManStop(p_00);
    p_00 = pGVar14;
  }
  else if (pPars->fVerbose != 0) {
    printf("Before cleanup = %d nodes. After cleanup = %d nodes.\n",(ulong)uVar16);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFramesInit( Gia_Man_t * pAig, Gia_ParFra_t * pPars )
{
    int fUseAllPis = 1;
    Gia_Man_t * pFrames, * pTemp;
    Gia_ManFra_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vIns, * vAnds, * vOuts;
    int i, f;
    p = Gia_ManFraStart( pAig, pPars );
    Gia_ManFraSupports( p );
    pFrames = Gia_ManStart( Vec_VecSizeSize((Vec_Vec_t*)p->vIns)+
        Vec_VecSizeSize((Vec_Vec_t*)p->vAnds)+Vec_VecSizeSize((Vec_Vec_t*)p->vOuts) );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    Gia_ManHashAlloc( pFrames );
    Gia_ManConst0(pAig)->Value = 0;
    for ( f = 0; f < pPars->nFrames; f++ )
    {
        vIns  = (Vec_Int_t *)Vec_PtrEntry( p->vIns,  f );
        vAnds = (Vec_Int_t *)Vec_PtrEntry( p->vAnds, f );
        vOuts = (Vec_Int_t *)Vec_PtrEntry( p->vOuts, f );
        if ( pPars->fVerbose )
            printf( "Frame %3d : CI = %6d. AND = %6d. CO = %6d.\n", 
            f, Vec_IntSize(vIns), Vec_IntSize(vAnds), Vec_IntSize(vOuts) );
        if ( fUseAllPis )
        {
            Gia_ManForEachPi( pAig, pObj, i )
                pObj->Value = Gia_ManAppendCi( pFrames );
            if ( f == 0 )
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( !Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = 0;
                }
            }
            else
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( !Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ObjRoToRi(pAig, pObj)->Value;
                }
            }
        }
        else
        {
            if ( f == 0 )
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ManAppendCi( pFrames );
                    else
                        pObj->Value = 0;
                }
            }
            else
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ManAppendCi( pFrames );
                    else
                        pObj->Value = Gia_ObjRoToRi(pAig, pObj)->Value;
                }
            }
        }
        Gia_ManForEachObjVec( vAnds, pAig, pObj, i )
        {
            assert( Gia_ObjIsAnd(pObj) );
            pObj->Value = Gia_ManHashAnd( pFrames, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        Gia_ManForEachObjVec( vOuts, pAig, pObj, i )
        {
            assert( Gia_ObjIsCo(pObj) );
            if ( Gia_ObjIsPo(pAig, pObj) )
                pObj->Value = Gia_ManAppendCo( pFrames, Gia_ObjFanin0Copy(pObj) );
            else
                pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
    }
    Gia_ManFraStop( p );
    Gia_ManHashStop( pFrames );
    if ( Gia_ManCombMarkUsed(pFrames) < Gia_ManAndNum(pFrames) )
    {
        pFrames = Gia_ManDupMarked( pTemp = pFrames );
        if ( pPars->fVerbose )
            printf( "Before cleanup = %d nodes. After cleanup = %d nodes.\n", 
                Gia_ManAndNum(pTemp), Gia_ManAndNum(pFrames) );
        Gia_ManStop( pTemp );
    }
    else if ( pPars->fVerbose )
            printf( "Before cleanup = %d nodes. After cleanup = %d nodes.\n", 
                Gia_ManAndNum(pFrames), Gia_ManAndNum(pFrames) );
    return pFrames;
}